

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::write<char,fmt::v8::appender>
                   (appender out,char value,basic_format_specs<char> *specs,locale_ref loc)

{
  bool bVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar2;
  error_handler local_21;
  
  bVar1 = check_char_specs<char,fmt::v8::detail::error_handler>(specs,&local_21);
  if (bVar1) {
    bVar2.container = (buffer<char> *)write_char<char,fmt::v8::appender>(out,value,specs);
  }
  else {
    bVar2.container =
         (buffer<char> *)write<char,_fmt::v8::appender,_int,_0>(out,(int)value,specs,loc);
  }
  return (appender)bVar2.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, Char value,
                         const basic_format_specs<Char>& specs,
                         locale_ref loc = {}) -> OutputIt {
  return check_char_specs(specs)
             ? write_char(out, value, specs)
             : write(out, static_cast<int>(value), specs, loc);
}